

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.hpp
# Opt level: O2

void __thiscall
Centaurus::CATNNode<wchar_t>::import_transitions
          (CATNNode<wchar_t> *this,NFAState<wchar_t> *state,int offset)

{
  pointer pNVar1;
  pointer this_00;
  NFATransition<wchar_t> local_60;
  
  pNVar1 = (state->m_transitions).
           super__Vector_base<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (state->m_transitions).
                 super__Vector_base<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != pNVar1; this_00 = this_00 + 1
      ) {
    NFATransition<wchar_t>::offset(&local_60,this_00,offset);
    std::vector<Centaurus::NFATransition<wchar_t>,std::allocator<Centaurus::NFATransition<wchar_t>>>
    ::emplace_back<Centaurus::NFATransition<wchar_t>>
              ((vector<Centaurus::NFATransition<wchar_t>,std::allocator<Centaurus::NFATransition<wchar_t>>>
                *)&this->m_transitions,&local_60);
    NFATransition<wchar_t>::~NFATransition(&local_60);
  }
  return;
}

Assistant:

void import_transitions(const NFAState<TCHAR>& state, int offset)
    {
        for (const auto& tr : state.get_transitions())
        {
            m_transitions.push_back(tr.offset(offset));
        }
    }